

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void schemaIsValid(Parse *pParse)

{
  u8 uVar1;
  sqlite3 *db;
  Btree *p;
  u32 *puVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long in_FS_OFFSET;
  int cookie;
  u32 local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  db = pParse->db;
  local_3c = 0xaaaaaaaa;
  if (0 < db->nDb) {
    lVar6 = 0;
    lVar5 = 0;
    do {
      p = *(Btree **)((long)&db->aDb->pBt + lVar6);
      if (p == (Btree *)0x0) {
        bVar3 = false;
        goto LAB_0015c979;
      }
      uVar1 = p->inTrans;
      if (uVar1 == '\0') {
        if ((p->sharable != '\0') || (iVar4 = 0, p->inTrans == '\0')) {
          iVar4 = btreeBeginTrans(p,0,(int *)0x0);
        }
        if (iVar4 == 0) goto LAB_0015c921;
        bVar3 = true;
        if ((iVar4 == 0xc0a) || (iVar4 == 7)) {
          sqlite3OomFault(db);
          pParse->rc = 7;
          if (iVar4 == 0) goto LAB_0015c921;
        }
      }
      else {
LAB_0015c921:
        sqlite3BtreeGetMeta(p,1,&local_3c);
        puVar2 = *(u32 **)((long)&db->aDb->pSchema + lVar6);
        if (local_3c != *puVar2) {
          if ((*(byte *)((long)puVar2 + 0x72) & 1) != 0) {
            pParse->rc = 0x11;
          }
          sqlite3ResetOneSchema(db,(int)lVar5);
        }
        bVar3 = false;
        if (uVar1 == '\0') {
          sqlite3BtreeCommit(p);
        }
      }
LAB_0015c979:
      if (bVar3) break;
      lVar5 = lVar5 + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar5 < db->nDb);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void schemaIsValid(Parse *pParse){
  sqlite3 *db = pParse->db;
  int iDb;
  int rc;
  int cookie;

  assert( pParse->checkSchema );
  assert( sqlite3_mutex_held(db->mutex) );
  for(iDb=0; iDb<db->nDb; iDb++){
    int openedTransaction = 0;         /* True if a transaction is opened */
    Btree *pBt = db->aDb[iDb].pBt;     /* Btree database to read cookie from */
    if( pBt==0 ) continue;

    /* If there is not already a read-only (or read-write) transaction opened
    ** on the b-tree database, open one now. If a transaction is opened, it
    ** will be closed immediately after reading the meta-value. */
    if( sqlite3BtreeTxnState(pBt)==SQLITE_TXN_NONE ){
      rc = sqlite3BtreeBeginTrans(pBt, 0, 0);
      if( rc==SQLITE_NOMEM || rc==SQLITE_IOERR_NOMEM ){
        sqlite3OomFault(db);
        pParse->rc = SQLITE_NOMEM;
      }
      if( rc!=SQLITE_OK ) return;
      openedTransaction = 1;
    }

    /* Read the schema cookie from the database. If it does not match the
    ** value stored as part of the in-memory schema representation,
    ** set Parse.rc to SQLITE_SCHEMA. */
    sqlite3BtreeGetMeta(pBt, BTREE_SCHEMA_VERSION, (u32 *)&cookie);
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    if( cookie!=db->aDb[iDb].pSchema->schema_cookie ){
      if( DbHasProperty(db, iDb, DB_SchemaLoaded) ) pParse->rc = SQLITE_SCHEMA;
      sqlite3ResetOneSchema(db, iDb);
    }

    /* Close the transaction, if one was opened. */
    if( openedTransaction ){
      sqlite3BtreeCommit(pBt);
    }
  }
}